

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onehot.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  bool bVar6;
  allocator local_3f1;
  int vector_length;
  int index;
  string local_3e8;
  vector<double,_std::allocator<double>_> onehot_vector;
  ostringstream error_message_4;
  ifstream ifs;
  byte abStack_218 [488];
  
  vector_length = 10;
  do {
    while (iVar3 = ya_getopt_long(argc,argv,"l:m:h",(option *)0x0,(int *)0x0), iVar3 == 0x6c) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
      bVar6 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
      bVar1 = vector_length < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar6 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_4,"onehot",(allocator *)&local_3e8);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
LAB_00102869:
        std::__cxx11::string::~string((string *)&error_message_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar3 != 0x6d) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) {
          anon_unknown.dwarf_2ad7::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        anon_unknown.dwarf_2ad7::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string((string *)&error_message_4,"onehot",(allocator *)&local_3e8);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_00102869;
      }
      if (argc == ya_optind) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&error_message_4,"onehot",(allocator *)&local_3e8);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_00102869;
      }
      std::ifstream::ifstream(this);
      if ((pcVar5 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        poVar4 = std::operator<<((ostream *)&error_message_4,"Cannot open file ");
        std::operator<<(poVar4,pcVar5);
        std::__cxx11::string::string((string *)&local_3e8,"onehot",(allocator *)&onehot_vector);
        sptk::PrintErrorMessage(&local_3e8,&error_message_4);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
        iVar3 = 1;
        goto LAB_001029f1;
      }
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        this = (ostringstream *)&std::cin;
      }
      _error_message_4 = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&onehot_vector,(long)vector_length,(value_type_conflict *)&error_message_4,
                 (allocator_type *)&local_3e8);
      iVar3 = 0;
      break;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
    bVar6 = vector_length < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_4,"onehot",(allocator *)&local_3e8);
      sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
      goto LAB_00102869;
    }
    vector_length = vector_length + 1;
  } while( true );
LAB_001028ea:
  bVar1 = sptk::ReadStream<int>(&index,(istream *)this);
  if (!bVar1) {
    iVar3 = 0;
LAB_001029e7:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&onehot_vector.super__Vector_base<double,_std::allocator<double>_>);
LAB_001029f1:
    std::ifstream::~ifstream(&ifs);
    return iVar3;
  }
  if (((long)index < 0) || (vector_length <= index)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&error_message_4,iVar3);
    std::operator<<(poVar4,"th sample is out of range");
    std::__cxx11::string::string((string *)&local_3e8,"onehot",&local_3f1);
    sptk::PrintErrorMessage(&local_3e8,&error_message_4);
LAB_001029d0:
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
    iVar3 = 1;
    goto LAB_001029e7;
  }
  onehot_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[index] = 1.0;
  bVar1 = sptk::WriteStream<double>(0,vector_length,&onehot_vector,(ostream *)&std::cout,(int *)0x0)
  ;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to write one-hot vector");
    std::__cxx11::string::string((string *)&local_3e8,"onehot",&local_3f1);
    sptk::PrintErrorMessage(&local_3e8,&error_message_4);
    goto LAB_001029d0;
  }
  onehot_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[index] = 0.0;
  iVar3 = iVar3 + 1;
  goto LAB_001028ea;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("onehot", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("onehot", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("onehot", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("onehot", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  int index;
  std::vector<double> onehot_vector(vector_length, 0.0);

  for (int sample_index(0); sptk::ReadStream(&index, &input_stream);
       ++sample_index) {
    if (index < 0 || vector_length <= index) {
      std::ostringstream error_message;
      error_message << sample_index << "th sample is out of range";
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
    onehot_vector[index] = 1.0;
    if (!sptk::WriteStream(0, vector_length, onehot_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write one-hot vector";
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
    // cppcheck-suppress unreadVariable
    onehot_vector[index] = 0.0;
  }

  return 0;
}